

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O0

void err_add_error_vdata(uint num,__va_list_tag *args)

{
  uint uVar1;
  void *pvVar2;
  size_t sVar3;
  char *__size;
  char *data;
  char *pcVar4;
  undefined8 *local_90;
  undefined8 *local_78;
  ulong local_60;
  size_t i_1;
  size_t substr_len;
  size_t i;
  va_list args_copy;
  char *buf;
  char *substr;
  size_t total_size;
  __va_list_tag *args_local;
  uint num_local;
  
  substr = (char *)0x0;
  pvVar2 = args->reg_save_area;
  i._0_4_ = args->gp_offset;
  i._4_4_ = args->fp_offset;
  args_copy[0]._0_8_ = args->overflow_arg_area;
  for (substr_len = 0; substr_len < num; substr_len = substr_len + 1) {
    if ((uint)i < 0x29) {
      local_78 = (undefined8 *)((long)(int)(uint)i + (long)pvVar2);
      i._0_4_ = (uint)i + 8;
    }
    else {
      local_78 = (undefined8 *)args_copy[0]._0_8_;
      args_copy[0]._0_8_ = args_copy[0]._0_8_ + 8;
    }
    if ((char *)*local_78 != (char *)0x0) {
      sVar3 = strlen((char *)*local_78);
      if (-(long)substr - 1U < sVar3) {
        return;
      }
      substr = substr + sVar3;
    }
  }
  if (substr != (char *)0xffffffffffffffff) {
    __size = substr + 1;
    data = (char *)malloc((size_t)__size);
    if (data != (char *)0x0) {
      *data = '\0';
      for (local_60 = 0; local_60 < num; local_60 = local_60 + 1) {
        uVar1 = args->gp_offset;
        if (uVar1 < 0x29) {
          local_90 = (undefined8 *)((long)(int)uVar1 + (long)args->reg_save_area);
          args->gp_offset = uVar1 + 8;
        }
        else {
          local_90 = (undefined8 *)args->overflow_arg_area;
          args->overflow_arg_area = local_90 + 1;
        }
        if (((char *)*local_90 != (char *)0x0) &&
           (pcVar4 = (char *)OPENSSL_strlcat(data,(char *)*local_90,(size_t)__size),
           __size <= pcVar4)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err.cc"
                        ,0x288,"void err_add_error_vdata(unsigned int, __va_list_tag *)");
        }
      }
      err_set_error_data(data);
    }
  }
  return;
}

Assistant:

static void err_add_error_vdata(unsigned num, va_list args) {
  size_t total_size = 0;
  const char *substr;
  char *buf;

  va_list args_copy;
  va_copy(args_copy, args);
  for (size_t i = 0; i < num; i++) {
    substr = va_arg(args_copy, const char *);
    if (substr == NULL) {
      continue;
    }
    size_t substr_len = strlen(substr);
    if (SIZE_MAX - total_size < substr_len) {
      return;  // Would overflow.
    }
    total_size += substr_len;
  }
  va_end(args_copy);
  if (total_size == SIZE_MAX) {
    return;  // Would overflow.
  }
  total_size += 1;  // NUL terminator.
  if ((buf = reinterpret_cast<char *>(malloc(total_size))) == NULL) {
    return;
  }
  buf[0] = '\0';
  for (size_t i = 0; i < num; i++) {
    substr = va_arg(args, const char *);
    if (substr == NULL) {
      continue;
    }
    if (OPENSSL_strlcat(buf, substr, total_size) >= total_size) {
      assert(0);  // should not be possible.
    }
  }
  err_set_error_data(buf);
}